

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcRampFlightType::IfcRampFlightType(IfcRampFlightType *this)

{
  *(undefined ***)&this->field_0x1c0 = &PTR__Object_007e6a70;
  *(undefined8 *)&this->field_0x1c8 = 0;
  *(char **)&this->field_0x1d0 = "IfcRampFlightType";
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__00813780);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x813650;
  *(undefined8 *)&this->field_0x1c0 = 0x813768;
  *(undefined8 *)&this->field_0x88 = 0x813678;
  *(undefined8 *)&this->field_0x98 = 0x8136a0;
  *(undefined8 *)&this->field_0xf0 = 0x8136c8;
  *(undefined8 *)&this->field_0x148 = 0x8136f0;
  *(undefined8 *)&this->field_0x180 = 0x813718;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x813740;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcRampFlightType() : Object("IfcRampFlightType") {}